

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gptgen.cpp
# Opt level: O2

int read_mbr(string *drive,uint64_t lba,int block_size,char *buf)

{
  int iVar1;
  char *buf_00;
  string local_50;
  
  buf_00 = (char *)operator_new__((long)block_size);
  std::__cxx11::string::string((string *)&local_50,(string *)drive);
  iVar1 = read_block(&local_50,lba,block_size,buf_00);
  std::__cxx11::string::~string((string *)&local_50);
  if (-1 < iVar1) {
    memcpy(buf,buf_00,0x1be);
  }
  operator_delete__(buf_00);
  return iVar1;
}

Assistant:

int read_mbr(string drive, uint64_t lba, int block_size, char *buf)
{
	char *tmpbuf = new char[block_size];
	int ret;

	ret = read_block(drive, lba, block_size, tmpbuf);
	if (ret >= 0) memcpy(buf, tmpbuf, 446);
	delete [] tmpbuf;
	return ret;
}